

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O1

bool __thiscall LTFlightData::CreateAircraft(LTFlightData *this,double simTime)

{
  ulong uVar1;
  recursive_mutex *__mutex;
  _Map_pointer pppVar2;
  bool bVar3;
  int iVar4;
  _Elt_pointer ppVar5;
  LTAircraft *pLVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  string sPosDeque;
  
  if (this->pAc != (LTAircraft *)0x0) {
    return true;
  }
  bVar3 = AcSlotAvailable(this);
  if (bVar3) {
    __mutex = &this->dataAccessMutex;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    bVar3 = CalcNextPos(this,simTime);
    if (bVar3) {
      while (pppVar2 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node,
            ppVar5 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_cur,
            1 < ((long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar5 >> 3) *
                -0x71c71c71c71c71c7 +
                ((long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x71c71c71c71c71c7
                + (((long)pppVar2 -
                    (long)(this->posDeque).
                          super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                  (ulong)(pppVar2 == (_Map_pointer)0x0)) * 7) {
        lVar8 = (long)ppVar5 -
                (long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_first;
        lVar7 = lVar8 >> 3;
        uVar1 = lVar7 * -0x71c71c71c71c71c7 + 1;
        if (uVar1 < 7) {
          ppVar5 = ppVar5 + 1;
        }
        else {
          if (lVar8 < -0x47) {
            uVar9 = ~((lVar7 * 0x71c71c71c71c71c7 - 2U) / 7);
          }
          else {
            uVar9 = uVar1 / 7;
          }
          ppVar5 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_node[uVar9] + uVar9 * -7 + uVar1;
        }
        if (simTime < ppVar5->_ts) break;
        std::deque<positionTy,_std::allocator<positionTy>_>::pop_front(&this->posDeque);
      }
      bVar3 = validForAcCreate(this,simTime);
      if (bVar3) {
        positionDeque2String_abi_cxx11_(&sPosDeque,&this->posDeque,(positionTy *)0x0);
        DetermineAcModel(this);
        if (((this->statData).acTypeIcao._M_string_length == 0) && ((int)dataRefs.iLogLevel < 3)) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                 ,0xab1,"CreateAircraft",logWARN,
                 "Tracking data for \'%s\' (man \'%s\', mdl \'%s\') lacks ICAO a/c type code, can\'t derive type -> will be rendered with standard a/c %s"
                 ,(this->acKey).key._M_dataplus._M_p,(this->statData).man._M_dataplus._M_p,
                 (this->statData).mdl._M_dataplus._M_p,dataRefs.sDefaultAcIcaoType._M_dataplus._M_p)
          ;
        }
        pLVar6 = (LTAircraft *)operator_new(0x958);
        LTAircraft::LTAircraft(pLVar6,this);
        this->pAc = pLVar6;
        pLVar6 = this->pAc;
        if ((pLVar6 == (LTAircraft *)0x0) && ((int)dataRefs.iLogLevel < 4)) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                 ,0xac5,"CreateAircraft",logERR,"Could not create new object (memory?): %s",
                 (this->acKey).key._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sPosDeque._M_dataplus._M_p != &sPosDeque.field_2) {
          operator_delete(sPosDeque._M_dataplus._M_p,sPosDeque.field_2._M_allocated_capacity + 1);
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (pLVar6 == (LTAircraft *)0x0) {
          return false;
        }
        return true;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return false;
}

Assistant:

bool LTFlightData::CreateAircraft ( double simTime )
{
    // short-cut if exists already
    if ( hasAc() ) return true;
    
    // exit if too many a/c shown and this one wouldn't be one of the nearest ones
    if (!AcSlotAvailable())
        return false;
    
    try {
        // get the  mutex, not so much for protection,
        // but to speed up creation (which read-accesses lots of data and
        // thus makes many calls to the lock, which are now just quick recursive calls)
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);
        
        // make sure positional data is up-to-date
        // (also does a last validation...and now with lock, so that state is secured)
        if ( !CalcNextPos(simTime) )
            return false;
        
        // This can have change data in the posDeque...let's see if we are still valid for a/c create
        // Remove outdated positions from posDeque, ie. all positions before simTime
        while (posDeque.size() >= 2 && posDeque[1].ts() <= simTime)
            posDeque.pop_front();
        if ( !validForAcCreate(simTime) )
            return false;
        
        // There are yet unsolved errors where the subsequent aircraft creation failes with an
        // empty posDeque, though we just - while holding the dataAccessMutex - have verified
        // that we are valid for creation. See Issue #174.
        // Next time we see that bug we want to know what NOW is in posDeque:
        const std::string sPosDeque = positionDeque2String(posDeque);
        
        // Make sure we have a valid a/c model now
        DetermineAcModel();
        if (statData.acTypeIcao.empty()) {          // we don't...
            LOG_MSG(logWARN,ERR_NO_AC_TYPE,
                    key().c_str(),
                    statData.man.c_str(), statData.mdl.c_str(),
                    dataRefs.GetDefaultAcIcaoType().c_str());
        }

        // create the object (constructor will recursively re-access the lock)
        try {
            pAc = new LTAircraft(*this);
        } catch (const std::exception& e) {
            LOG_MSG(logERR, ERR_EXCEPTION_AC_CREATE,
                    key().c_str(), statData.acTypeIcao.c_str(),
                    e.what(), sPosDeque.c_str());
            pAc = nullptr;
        }
        catch(...) {
            LOG_MSG(logERR, ERR_UNKN_EXCP_AC_CREATE,
                    key().c_str(), statData.acTypeIcao.c_str(),
                    "<?>", sPosDeque.c_str());
            pAc = nullptr;
        }
        if (!pAc)
        {
            LOG_MSG(logERR,ERR_NEW_OBJECT,key().c_str());
            return false;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    // success
    return true;
}